

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExecuteInstruction.cpp
# Opt level: O0

int do_mov(void)

{
  short sVar1;
  uint *puVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  char *pcVar7;
  undefined4 *puVar8;
  char cVar9;
  ulong uVar10;
  ulong uVar11;
  uint *R_20;
  uint *temp_20;
  uint value1_5;
  uint value_17;
  int16_t *R_19;
  int16_t *temp_19;
  uint value1_4;
  uint value_16;
  char *R_18;
  char *temp_18;
  uint value1_3;
  uint value_15;
  char *data_temp_p_5;
  uint8_t highb_6;
  uint8_t lowb_3;
  uint8_t highb1_1;
  uint8_t lowb1_1;
  uint *R_17;
  uint *temp_17;
  uint value1_2;
  uint value_14;
  int16_t *R_16;
  int16_t *temp_16;
  uint value1_1;
  uint value_13;
  char *R_15;
  char *temp_15;
  uint value1;
  uint value_12;
  char *data_temp_p_4;
  uint8_t highb_5;
  uint8_t lowb_2;
  uint8_t highb1;
  uint8_t lowb1;
  uint *R_14;
  uint *temp_14;
  uint value_11;
  int16_t *R_13;
  int16_t *temp_13;
  uint value_10;
  char *R_12;
  char *temp_12;
  uint value_9;
  char *data_temp_p_3;
  short i_1;
  uint8_t highb_4;
  uint8_t lowb_1;
  uint *R_11;
  uint temp_11;
  uint value_8;
  int16_t *R_10;
  int16_t temp_10;
  uint value_7;
  char *R_9;
  char temp_9;
  uint value_6;
  char *data_temp_p_2;
  short i;
  uint8_t highb_3;
  uint *R_8;
  uint *temp_8;
  uint value_5;
  int16_t *R_7;
  int16_t *temp_7;
  uint value_4;
  char *R_6;
  char *temp_6;
  uint value_3;
  char *data_temp_p_1;
  uint8_t highb_2;
  uint8_t lowb;
  uint *R_5;
  uint temp_5;
  uint value_2;
  int16_t *R_4;
  int16_t temp_4;
  uint value_1;
  char *R_3;
  char temp_3;
  uint value;
  char *data_temp_p;
  uint8_t highb_1;
  uint *R_2;
  uint temp_2;
  int16_t *R_1;
  uint temp_1;
  char *R;
  uint temp;
  uint *Rb_2;
  uint *Ra_2;
  int16_t *Rb_1;
  int16_t *Ra_1;
  char *Rb;
  char *Ra;
  uint8_t highb;
  uint8_t o_low;
  uint8_t low;
  uint8_t high;
  
  pcVar7 = data_ptr;
  bVar3 = (byte)code_ptr[registe_ptr->IP + 2] >> 4;
  uVar11 = (ulong)(registe_ptr->IP + 2);
  uVar10 = CONCAT71((int7)((ulong)code_ptr >> 8),code_ptr[uVar11]) & 0xffffffffffffff0f;
  cVar9 = (char)uVar10;
  switch(code_ptr[registe_ptr->IP + 1] & 0xf) {
  case 0:
    bVar5 = (byte)code_ptr[registe_ptr->IP + 3] / 0x10;
    if (cVar9 == '\0') {
      puVar2 = register_list[bVar3];
      *(char *)puVar2 = (char)*register_list[bVar5];
      set_flag((char)*puVar2);
    }
    else if (cVar9 == '\x01') {
      puVar2 = register_list[bVar3];
      *(int16_t *)puVar2 = (int16_t)*register_list[bVar5];
      set_flag((int16_t)*puVar2);
    }
    else {
      if (cVar9 != '\x02') {
        puVar8 = (undefined4 *)
                 __cxa_allocate_exception
                           (4,uVar11,(ulong)(byte)code_ptr[registe_ptr->IP + 3] % 0x10);
        *puVar8 = 0xf6;
        __cxa_throw(puVar8,&int::typeinfo,0);
      }
      puVar2 = register_list[bVar3];
      *puVar2 = *register_list[bVar5];
      set_flag(*puVar2);
    }
    break;
  case 1:
    if (cVar9 == '\0') {
      puVar2 = register_list[bVar3];
      *(char *)puVar2 = code_ptr[registe_ptr->IP + 3];
      set_flag((char)*puVar2);
    }
    else if (cVar9 == '\x01') {
      puVar2 = register_list[bVar3];
      *(int16_t *)puVar2 = *(int16_t *)(code_ptr + (ulong)registe_ptr->IP + 3);
      set_flag((int16_t)*puVar2);
    }
    else {
      if (cVar9 != '\x02') {
        puVar8 = (undefined4 *)__cxa_allocate_exception(4);
        *puVar8 = 0xf6;
        __cxa_throw(puVar8,&int::typeinfo,0);
      }
      puVar2 = register_list[bVar3];
      *puVar2 = *(uint *)(code_ptr + (ulong)registe_ptr->IP + 3);
      set_flag(*puVar2);
    }
    break;
  case 2:
    bVar5 = (byte)code_ptr[registe_ptr->IP + 3] / 0x10;
    if (registe_ptr->flag[0xe] == '\x01') {
      data_ptr = stack_ptr;
    }
    if (cVar9 == '\0') {
      *(char *)register_list[bVar3] = data_ptr[*register_list[bVar5]];
      if (registe_ptr->flag[0xe] == '\x01') {
        data_ptr = pcVar7;
      }
    }
    else if (cVar9 == '\x01') {
      *(undefined2 *)register_list[bVar3] = *(undefined2 *)(data_ptr + *register_list[bVar5]);
      if (registe_ptr->flag[0xe] == '\x01') {
        data_ptr = pcVar7;
      }
    }
    else {
      if (cVar9 != '\x02') {
        puVar8 = (undefined4 *)
                 __cxa_allocate_exception
                           (4,uVar11,(ulong)(byte)code_ptr[registe_ptr->IP + 3] % 0x10);
        *puVar8 = 0xf6;
        __cxa_throw(puVar8,&int::typeinfo,0);
      }
      *register_list[bVar3] = *(uint *)(data_ptr + *register_list[bVar5]);
      if (registe_ptr->flag[0xe] == '\x01') {
        data_ptr = pcVar7;
      }
    }
    break;
  case 3:
    bVar5 = (byte)code_ptr[registe_ptr->IP + 3] % 0x10;
    bVar6 = (byte)code_ptr[registe_ptr->IP + 3] / 0x10;
    if (registe_ptr->flag[0xe] == '\x01') {
      data_ptr = stack_ptr;
    }
    if (bVar5 == 0) {
      data_ptr[*register_list[bVar3]] = (char)*register_list[bVar6];
      if (registe_ptr->flag[0xe] == '\x01') {
        data_ptr = pcVar7;
      }
    }
    else if (bVar5 == 1) {
      *(short *)(data_ptr + *register_list[bVar3]) = (short)*register_list[bVar6];
      if (registe_ptr->flag[0xe] == '\x01') {
        data_ptr = pcVar7;
      }
    }
    else {
      if (bVar5 != 2) {
        puVar8 = (undefined4 *)
                 __cxa_allocate_exception
                           (4,uVar11,(ulong)(byte)code_ptr[registe_ptr->IP + 3] % 0x10);
        *puVar8 = 0xf6;
        __cxa_throw(puVar8,&int::typeinfo,0);
      }
      *(uint *)(data_ptr + *register_list[bVar3]) = *register_list[bVar6];
      if (registe_ptr->flag[0xe] == '\x01') {
        data_ptr = pcVar7;
      }
    }
    break;
  default:
switchD_001039a1_caseD_4:
    puVar8 = (undefined4 *)__cxa_allocate_exception(4,uVar11,uVar10);
    *puVar8 = 0xf6;
    __cxa_throw(puVar8,&int::typeinfo,0);
  case 7:
    bVar5 = (byte)code_ptr[registe_ptr->IP + 3] / 0x10;
    sVar1 = *(short *)(code_ptr + (ulong)registe_ptr->IP + 5);
    if (registe_ptr->flag[0xe] == '\x01') {
      data_ptr = stack_ptr;
    }
    if (cVar9 == '\0') {
      *(char *)register_list[bVar3] = data_ptr[(int)sVar1 + *register_list[bVar5]];
      if (registe_ptr->flag[0xe] == '\x01') {
        data_ptr = pcVar7;
      }
    }
    else if (cVar9 == '\x01') {
      *(undefined2 *)register_list[bVar3] =
           *(undefined2 *)(data_ptr + (ulong)*register_list[bVar5] + (long)(int)sVar1);
      if (registe_ptr->flag[0xe] == '\x01') {
        data_ptr = pcVar7;
      }
    }
    else {
      if (cVar9 != '\x02') {
        puVar8 = (undefined4 *)
                 __cxa_allocate_exception
                           (4,uVar11,(ulong)(byte)code_ptr[registe_ptr->IP + 3] % 0x10);
        *puVar8 = 0xf6;
        __cxa_throw(puVar8,&int::typeinfo,0);
      }
      *register_list[bVar3] = *(uint *)(data_ptr + (ulong)*register_list[bVar5] + (long)(int)sVar1);
      if (registe_ptr->flag[0xe] == '\x01') {
        data_ptr = pcVar7;
      }
    }
    break;
  case 8:
    bVar5 = (byte)code_ptr[registe_ptr->IP + 6] % 0x10;
    bVar6 = (byte)code_ptr[registe_ptr->IP + 6] / 0x10;
    sVar1 = *(short *)(code_ptr + (ulong)registe_ptr->IP + 4);
    if (registe_ptr->flag[0xe] == '\x01') {
      data_ptr = stack_ptr;
    }
    if (bVar5 == 0) {
      data_ptr[(ulong)*register_list[bVar3] + (long)(int)sVar1] = (char)*register_list[bVar6];
      if (registe_ptr->flag[0xe] == '\x01') {
        data_ptr = pcVar7;
      }
    }
    else if (bVar5 == 1) {
      *(short *)(data_ptr + (ulong)*register_list[bVar3] + (long)(int)sVar1) =
           (short)*register_list[bVar6];
      if (registe_ptr->flag[0xe] == '\x01') {
        data_ptr = pcVar7;
      }
    }
    else if ((bVar5 == 2) &&
            (*(uint *)(data_ptr + (ulong)*register_list[bVar3] + (long)(int)sVar1) =
                  *register_list[bVar6], registe_ptr->flag[0xe] == '\x01')) {
      data_ptr = pcVar7;
    }
    break;
  case 9:
    bVar5 = (byte)code_ptr[registe_ptr->IP + 3] / 0x10;
    bVar6 = (byte)code_ptr[registe_ptr->IP + 4] % 0x10;
    bVar4 = (byte)code_ptr[registe_ptr->IP + 4] / 0x10;
    if (registe_ptr->flag[0xe] == '\x01') {
      data_ptr = stack_ptr;
    }
    if (bVar6 == 0) {
      data_ptr[(ulong)*register_list[bVar5] + (ulong)*register_list[bVar3]] =
           (char)*register_list[bVar4];
      if (registe_ptr->flag[0xe] == '\x01') {
        data_ptr = pcVar7;
      }
    }
    else if (bVar6 == 1) {
      *(short *)(data_ptr + (ulong)*register_list[bVar5] + (ulong)*register_list[bVar3]) =
           (short)*register_list[bVar4];
      if (registe_ptr->flag[0xe] == '\x01') {
        data_ptr = pcVar7;
      }
    }
    else {
      if (bVar6 != 2) {
        puVar8 = (undefined4 *)
                 __cxa_allocate_exception
                           (4,uVar11,(ulong)(byte)code_ptr[registe_ptr->IP + 4] % 0x10);
        *puVar8 = 0xf6;
        __cxa_throw(puVar8,&int::typeinfo,0);
      }
      *(uint *)(data_ptr + (ulong)*register_list[bVar5] + (ulong)*register_list[bVar3]) =
           *register_list[bVar4];
      if (registe_ptr->flag[0xe] == '\x01') {
        data_ptr = pcVar7;
      }
    }
    break;
  case 10:
    bVar5 = (byte)code_ptr[registe_ptr->IP + 3] / 0x10;
    bVar6 = (byte)code_ptr[registe_ptr->IP + 4] / 0x10;
    uVar10 = (ulong)(byte)code_ptr[registe_ptr->IP + 4] % 0x10;
    if (registe_ptr->flag[0xe] == '\x01') {
      data_ptr = stack_ptr;
    }
    if (cVar9 == '\0') {
      *(char *)register_list[bVar3] =
           data_ptr[(ulong)*register_list[bVar5] + (ulong)*register_list[bVar6]];
      if (registe_ptr->flag[0xe] == '\x01') {
        data_ptr = pcVar7;
      }
    }
    else if (cVar9 == '\x01') {
      *(undefined2 *)register_list[bVar3] =
           *(undefined2 *)(data_ptr + (ulong)*register_list[bVar5] + (ulong)*register_list[bVar6]);
      if (registe_ptr->flag[0xe] == '\x01') {
        data_ptr = pcVar7;
      }
    }
    else {
      if (cVar9 != '\x02') goto switchD_001039a1_caseD_4;
      *register_list[bVar3] =
           *(uint *)(data_ptr + (ulong)*register_list[bVar5] + (ulong)*register_list[bVar6]);
      if (registe_ptr->flag[0xe] == '\x01') {
        data_ptr = pcVar7;
      }
    }
  }
  return 1;
}

Assistant:

int do_mov() {
	uint8_t high = (uint8_t)code_ptr[registe_ptr->IP + 2] / 0x10;
	uint8_t low= (uint8_t)code_ptr[registe_ptr->IP + 2] % 0x10;

	uint8_t o_low = (uint8_t)code_ptr[registe_ptr->IP + 1] % 0x10;

	switch (o_low)//操作类型
	{
	case '\x00': {//mov R,R  ---->0
		//
		uint8_t highb = (uint8_t)(code_ptr[registe_ptr->IP + 3]) / 0x10;
		if (low == 0) {
			char*Ra = (char *)register_list[high];
			char*Rb = (char*)register_list[highb];
			*Ra = *Rb;
			set_flag(*Ra);
			break;
		}
		else if (low == 1)
		{
			int16_t*Ra = (int16_t *)register_list[high];
			int16_t*Rb = (int16_t *)register_list[highb];
			*Ra = *Rb;
			set_flag(*Ra);
			break;
		}
		else if (low == 2)
		{
			unsigned*Ra = (unsigned *)register_list[high];
			unsigned*Rb = (unsigned*)register_list[highb];
			*Ra = *Rb;
			set_flag(*Ra);
			break;
		}
		else throw(LVM_EXECUTE_ERROR);
		break;
	}
	case '\x01': {//mov R,i   ----->1
		if (low == 0)//低位运算
		{
			unsigned temp = code_ptr[registe_ptr->IP + 2 + 1];//获得立即数
			char *R = (char *)register_list[high];
			*R = temp;
			set_flag(*R);
			break;
		}
		else if (low == 1)//高位运算
		{
			unsigned temp = *(short*)(code_ptr + registe_ptr->IP + 2 + 1);//获得立即数
			int16_t *R = (int16_t *)register_list[high];
			*R = temp;
			set_flag(*R);
			break;
		}
		else if (low == 2)//全运算
		{
			unsigned temp = *(unsigned*)(code_ptr + registe_ptr->IP + 2 + 1);//获得立即数
			unsigned *R = (unsigned *)register_list[high];
			*R = temp;
			set_flag(*R);
			break;
		}
		else throw(LVM_EXECUTE_ERROR);
		break;
	}
	case '\x02': {//R,[R] ----->2
		uint8_t highb = (uint8_t)code_ptr[registe_ptr->IP + 3] / 0x10;
		char *data_temp_p = data_ptr;
		if (registe_ptr->flag[14] == 1) data_ptr = stack_ptr;//操控栈段
		if (low == 0)//低位运算
		{
			unsigned value = *(unsigned*)register_list[highb];//获得Rb寄存器中的值
			char temp = data_ptr[value];//获取数据段的内容
			char *R = (char *)register_list[high];
			*R = temp;
			if (registe_ptr->flag[14] == 1) data_ptr = data_temp_p;//还原操作
			break;
		}
		else if (low == 1)//高位运算
		{
			unsigned value = *(unsigned*)register_list[highb];//获得Rb寄存器中的值
			int16_t temp = *(int16_t*)(data_ptr + value);//获取数据段的内容
			int16_t *R = (int16_t *)register_list[high];
			*R = temp;
			if (registe_ptr->flag[14] == 1) data_ptr = data_temp_p;//还原操作
			break;
		}
		else if (low == 2)//全运算
		{
			unsigned value = *(unsigned*)register_list[highb];//获得Rb寄存器中的值
			unsigned temp = *(unsigned*)(data_ptr + value);//获取数据段的内容
			unsigned *R = (unsigned *)register_list[high];
			*R = temp;
			if (registe_ptr->flag[14] == 1) data_ptr = data_temp_p;//还原操作
			break;
		}
		else throw(LVM_EXECUTE_ERROR);
		break;
	}
	case '\x03': {//[R],R----->3
		uint8_t lowb = (uint8_t)code_ptr[registe_ptr->IP + 3] % 0x10;
		uint8_t highb = (uint8_t)code_ptr[registe_ptr->IP + 3] / 0x10;
		char *data_temp_p = data_ptr;
		if (registe_ptr->flag[14] == 1) data_ptr = stack_ptr;//操控栈段
		if (lowb == 0)//低位运算
		{
			unsigned value = *(unsigned*)register_list[high];//获得Ra寄存器中的值
			char *temp = data_ptr + value;//获取数据指针
			char *R = (char *)register_list[highb];//获得Rb寄存器中的值
			*temp = *R;//写入
			if (registe_ptr->flag[14] == 1) data_ptr = data_temp_p;//还原操作
			break;
		}
		else if (lowb == 1)//高位运算
		{
			unsigned value = *(unsigned*)register_list[high];//获得Ra寄存器中的值
			int16_t *temp = (int16_t*)(data_ptr + value);//获取数据指针
			int16_t *R = (int16_t*)register_list[highb];//获得Rb寄存器中的值
			*temp = *R;//写入
			if (registe_ptr->flag[14] == 1) data_ptr = data_temp_p;//还原操作
			break;
		}
		else if (lowb == 2)//全运算
		{
			unsigned value = *(unsigned*)register_list[high];//获得Ra寄存器中的值
			unsigned *temp = (unsigned*)(data_ptr + value);//获取数据指针
			unsigned *R = (unsigned*)register_list[highb];//获得Rb寄存器中的值
			*temp = *R;//写入
			if (registe_ptr->flag[14] == 1) data_ptr = data_temp_p;//还原操作
			break;
		}
		else throw(LVM_EXECUTE_ERROR);
		break;
	}
	case '\x07': {//R, [R + i]----->07
		uint8_t highb = (uint8_t)code_ptr[registe_ptr->IP + 3] / 0x10;
		short i = *(short*)(code_ptr + registe_ptr->IP + 5);//获取立即数

		char *data_temp_p = data_ptr;
		if (registe_ptr->flag[14] == 1) data_ptr = stack_ptr;//操控栈段
		if (low == 0)//低位运算
		{
			unsigned value = *(unsigned*)register_list[highb];//获得Rb寄存器中的值
			char temp = data_ptr[i + value];//获取数据段的内容
			char *R = (char *)register_list[high];
			*R = temp;
			if (registe_ptr->flag[14] == 1) data_ptr = data_temp_p;//还原操作
			break;
		}
		else if (low == 1)//高位运算
		{
			unsigned value = *(unsigned*)register_list[highb];//获得Rb寄存器中的值
			int16_t temp = *(int16_t*)(data_ptr + i + value);//获取数据段的内容
			int16_t *R = (int16_t *)register_list[high];
			*R = temp;
			if (registe_ptr->flag[14] == 1) data_ptr = data_temp_p;//还原操作
			break;
		}
		else if (low == 2)//全运算
		{
			unsigned value = *(unsigned*)register_list[highb];//获得Rb寄存器中的值
			unsigned temp = *(unsigned*)(data_ptr + i + value);//获取数据段的内容
			unsigned *R = (unsigned *)register_list[high];
			*R = temp;
			if (registe_ptr->flag[14] == 1) data_ptr = data_temp_p;//还原操作
			break;
		}
		else throw(LVM_EXECUTE_ERROR);
		break;
	}
	case '\x08': {//[R+i],R----->08
		uint8_t lowb = (uint8_t)code_ptr[registe_ptr->IP + 6] % 0x10;
		uint8_t highb = (uint8_t)code_ptr[registe_ptr->IP + 6] / 0x10;
		short i = *(short*)(code_ptr + registe_ptr->IP + 4);//获取立即数

		char *data_temp_p = data_ptr;
		if (registe_ptr->flag[14] == 1) data_ptr = stack_ptr;//操控栈段
		if (lowb == 0)//低位运算
		{
			unsigned value = *(unsigned*)register_list[high];//获得Ra寄存器中的值
			char *temp = data_ptr + i + value;//获取数据指针
			char *R = (char *)register_list[highb];//获得Rb寄存器中的值
			*temp = *R;//写入
			if (registe_ptr->flag[14] == 1) data_ptr = data_temp_p;//还原操作
			break;
		}
		else if (lowb == 1)//高位运算
		{
			unsigned value = *(unsigned*)register_list[high];//获得Ra寄存器中的值
			int16_t *temp = (int16_t*)(data_ptr + i + value);//获取数据指针
			int16_t *R = (int16_t*)register_list[highb];//获得Rb寄存器中的值
			*temp = *R;//写入
			if (registe_ptr->flag[14] == 1) data_ptr = data_temp_p;//还原操作
			break;
		}
		else if (lowb == 2)//全运算
		{
			unsigned value = *(unsigned*)register_list[high];//获得Ra寄存器中的值
			unsigned *temp = (unsigned*)(data_ptr + i + value);//获取数据指针
			unsigned *R = (unsigned*)register_list[highb];//获得Rb寄存器中的值
			*temp = *R;//写入
			if (registe_ptr->flag[14] == 1) data_ptr = data_temp_p;//还原操作
			break;
		}
		break;
	}
	case'\x09': {//mov [R+R],R----->09
		uint8_t lowb1 = (uint8_t)code_ptr[registe_ptr->IP + 3] % 0x10;
		uint8_t highb1 = (uint8_t)code_ptr[registe_ptr->IP + 3] / 0x10;
		uint8_t lowb = (uint8_t)code_ptr[registe_ptr->IP + 4] % 0x10;
		uint8_t highb = (uint8_t)code_ptr[registe_ptr->IP + 4] / 0x10;
		char *data_temp_p = data_ptr;
		if (registe_ptr->flag[14] == 1) data_ptr = stack_ptr;//操控栈段
		if (lowb == 0)//低位运算
		{
			unsigned value = *(unsigned*)register_list[high];//获得Ra寄存器中的值
			unsigned value1 = *(unsigned*)register_list[highb1];//获得Ra1寄存器中的值
			char *temp = data_ptr + value + value1;//获取数据指针
			char *R = (char *)register_list[highb];//获得Rb寄存器中的值
			*temp = *R;//写入
			if (registe_ptr->flag[14] == 1) data_ptr = data_temp_p;//还原操作
			break;
		}
		else if (lowb == 1)//高位运算
		{
			unsigned value = *(unsigned*)register_list[high];//获得Ra寄存器中的值
			unsigned value1 = *(unsigned*)register_list[highb1];//获得Ra1寄存器中的值
			int16_t *temp = (int16_t*)(data_ptr + value + value1);//获取数据指针
			int16_t *R = (int16_t*)register_list[highb];//获得Rb寄存器中的值
			*temp = *R;//写入
			if (registe_ptr->flag[14] == 1) data_ptr = data_temp_p;//还原操作
			break;
		}
		else if (lowb == 2)//全运算
		{
			unsigned value = *(unsigned*)register_list[high];//获得Ra寄存器中的值
			unsigned value1 = *(unsigned*)register_list[highb1];//获得Ra1寄存器中的值
			unsigned *temp = (unsigned*)(data_ptr + value + value1);//获取数据指针
			unsigned *R = (unsigned*)register_list[highb];//获得Rb寄存器中的值
			*temp = *R;//写入
			if (registe_ptr->flag[14] == 1) data_ptr = data_temp_p;//还原操作
			break;
		}
		else throw(LVM_EXECUTE_ERROR);
		break;
	}
	case '\x0a': {//mov R,[R+R]----->0a
		uint8_t lowb1 = (uint8_t)code_ptr[registe_ptr->IP + 3] % 0x10;
		uint8_t highb1 = (uint8_t)code_ptr[registe_ptr->IP + 3] / 0x10;
		uint8_t lowb = (uint8_t)code_ptr[registe_ptr->IP + 4] % 0x10;
		uint8_t highb = (uint8_t)code_ptr[registe_ptr->IP + 4] / 0x10;
		char *data_temp_p = data_ptr;
		if (registe_ptr->flag[14] == 1) data_ptr = stack_ptr;//操控栈段
		if (low == 0)//低位运算
		{
			unsigned value = *(unsigned*)register_list[highb];//获得Ra寄存器中的值
			unsigned value1 = *(unsigned*)register_list[highb1];//获得Ra1寄存器中的值
			char *temp = data_ptr + value + value1;//获取数据指针
			char *R = (char *)register_list[high];//获得Rb寄存器中的值
			*R = *temp;//写入
			if (registe_ptr->flag[14] == 1) data_ptr = data_temp_p;//还原操作
			break;
		}
		else if (low == 1)//高位运算
		{
			unsigned value = *(unsigned*)register_list[highb];//获得Ra寄存器中的值
			unsigned value1 = *(unsigned*)register_list[highb1];//获得Ra1寄存器中的值
			int16_t *temp = (int16_t*)(data_ptr + value + value1);//获取数据指针
			int16_t *R = (int16_t*)register_list[high];//获得Rb寄存器中的值
			*R = *temp;//写入
			if (registe_ptr->flag[14] == 1) data_ptr = data_temp_p;//还原操作
			break;
		}
		else if (low == 2)//全运算
		{
			unsigned value = *(unsigned*)register_list[highb];//获得Ra寄存器中的值
			unsigned value1 = *(unsigned*)register_list[highb1];//获得Ra1寄存器中的值
			unsigned *temp = (unsigned*)(data_ptr + value + value1);//获取数据指针
			unsigned *R = (unsigned*)register_list[high];//获得Rb寄存器中的值
			*R = *temp;//写入
			if (registe_ptr->flag[14] == 1) data_ptr = data_temp_p;//还原操作
			break;
		}

	}
	default: {
		throw(LVM_EXECUTE_ERROR);
		break;
	}
	}
	return LVM_SUCCESS;

}